

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Velocitizer.cpp
# Opt level: O3

void __thiscall OpenMD::Velocitizer::scale(Velocitizer *this,RealType lambda)

{
  double *pdVar1;
  int iVar2;
  pointer ppSVar3;
  StuntDouble *pSVar4;
  Snapshot *pSVar5;
  Molecule *pMVar6;
  pointer ppSVar7;
  uint i;
  long lVar8;
  long lVar9;
  MoleculeIterator mi;
  double local_58 [4];
  double local_38 [3];
  RealType local_20;
  MoleculeIterator local_18;
  
  local_18._M_node = (_Base_ptr)0x0;
  local_20 = lambda;
  pMVar6 = SimInfo::beginMolecule(this->info_,&local_18);
  if (pMVar6 != (Molecule *)0x0) {
    do {
      ppSVar3 = (pMVar6->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppSVar7 = (pMVar6->integrableObjects_).
                     super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          (ppSVar7 != ppSVar3 && (pSVar4 = *ppSVar7, pSVar4 != (StuntDouble *)0x0));
          ppSVar7 = ppSVar7 + 1) {
        lVar8 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).velocity.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + pSVar4->storage_);
        local_38[2] = (double)*(undefined8 *)(lVar8 + 0x10 + (long)pSVar4->localIndex_ * 0x18);
        pdVar1 = (double *)(lVar8 + (long)pSVar4->localIndex_ * 0x18);
        local_38[0] = *pdVar1;
        local_38[1] = pdVar1[1];
        lVar8 = 0;
        do {
          local_38[lVar8] = local_38[lVar8] * local_20;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        pSVar5 = pSVar4->snapshotMan_->currentSnapshot_;
        lVar9 = (long)pSVar4->localIndex_;
        lVar8 = *(long *)((long)&(pSVar5->atomData).velocity.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + pSVar4->storage_);
        *(double *)(lVar8 + 0x10 + lVar9 * 0x18) = local_38[2];
        pdVar1 = (double *)(lVar8 + lVar9 * 0x18);
        *pdVar1 = local_38[0];
        pdVar1[1] = local_38[1];
        if (pSVar4->objType_ - otDAtom < 2) {
          lVar8 = *(long *)((long)&(pSVar5->atomData).angularMomentum.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + pSVar4->storage_);
          local_58[2] = (double)*(undefined8 *)(lVar8 + 0x10 + lVar9 * 0x18);
          pdVar1 = (double *)(lVar8 + lVar9 * 0x18);
          local_58[0] = *pdVar1;
          local_58[1] = pdVar1[1];
          lVar8 = 0;
          do {
            local_58[lVar8] = local_58[lVar8] * local_20;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          iVar2 = pSVar4->localIndex_;
          lVar8 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).
                                   angularMomentum.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + pSVar4->storage_);
          *(double *)(lVar8 + 0x10 + (long)iVar2 * 0x18) = local_58[2];
          pdVar1 = (double *)(lVar8 + (long)iVar2 * 0x18);
          *pdVar1 = local_58[0];
          pdVar1[1] = local_58[1];
        }
      }
      pMVar6 = SimInfo::nextMolecule(this->info_,&local_18);
    } while (pMVar6 != (Molecule *)0x0);
  }
  removeComDrift(this);
  if ((this->globals_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b == '\0') {
    removeAngularDrift(this);
  }
  return;
}

Assistant:

void Velocitizer::scale(RealType lambda) {
    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ioi;
    Molecule* mol;
    StuntDouble* sd;
    Vector3d v, j;

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd = mol->nextIntegrableObject(ioi)) {
        v = sd->getVel();
        v *= lambda;
        sd->setVel(v);

        if (sd->isDirectional()) {
          j = sd->getJ();
          j *= lambda;
          sd->setJ(j);
        }
      }
    }

    removeComDrift();

    // Remove angular drift if we are not using periodic boundary
    // conditions:

    if (!globals_->getUsePeriodicBoundaryConditions()) removeAngularDrift();
  }